

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NurseSolution.cpp
# Opt level: O2

bool __thiscall NurseSolution::removeTurn(NurseSolution *this,Turn *turn)

{
  bool bVar1;
  __normal_iterator<Turn_**,_std::vector<Turn_*,_std::allocator<Turn_*>_>_> __position;
  Turn *local_20;
  
  local_20 = turn;
  bVar1 = hasTurn(this,turn);
  if (bVar1) {
    __position = std::
                 __find_if<__gnu_cxx::__normal_iterator<Turn**,std::vector<Turn*,std::allocator<Turn*>>>,__gnu_cxx::__ops::_Iter_equals_val<Turn*const>>
                           ((this->turns).super__Vector_base<Turn_*,_std::allocator<Turn_*>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (this->turns).super__Vector_base<Turn_*,_std::allocator<Turn_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish,&local_20);
    std::vector<Turn_*,_std::allocator<Turn_*>_>::erase
              (&this->turns,(const_iterator)__position._M_current);
  }
  return bVar1;
}

Assistant:

const bool NurseSolution::removeTurn( Turn *turn) {
    if (!hasTurn(turn))
        return false;

    turns.erase(find(begin(turns), end(turns), turn));

    return true;
}